

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O2

void __thiscall Nes_Vrc6::reset(Nes_Vrc6 *this)

{
  int i;
  long lVar1;
  Nes_Vrc6 *pNVar2;
  int j;
  long lVar3;
  
  this->last_time = 0;
  pNVar2 = this;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      pNVar2->oscs[0].regs[lVar3] = '\0';
    }
    this->oscs[lVar1].delay = 0;
    this->oscs[lVar1].last_amp = 0;
    this->oscs[lVar1].phase = 1;
    this->oscs[lVar1].amp = 0;
    pNVar2 = (Nes_Vrc6 *)(pNVar2->oscs + 1);
  }
  return;
}

Assistant:

void Nes_Vrc6::reset()
{
	last_time = 0;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc& osc = oscs [i];
		for ( int j = 0; j < reg_count; j++ )
			osc.regs [j] = 0;
		osc.delay = 0;
		osc.last_amp = 0;
		osc.phase = 1;
		osc.amp = 0;
	}
}